

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.cpp
# Opt level: O2

void __thiscall
pstore::broker::command_processor::suicide
          (command_processor *this,fifo_path *param_1,broker_command *param_2)

{
  shared_ptr<pstore::broker::scavenger> scav;
  
  atomic_weak_ptr<pstore::broker::scavenger>::get
            ((atomic_weak_ptr<pstore::broker::scavenger> *)&scav);
  shutdown((int)this,
           (int)scav.super___shared_ptr<pstore::broker::scavenger,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&scav.super___shared_ptr<pstore::broker::scavenger,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

void command_processor::suicide (brokerface::fifo_path const &, broker_command const &) {
            std::shared_ptr<scavenger> const scav = scavenger_.get ();
            shutdown (this, scav.get (), sig_self_quit, num_read_threads_, http_status_,
                      uptime_done_);
        }